

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowNaiveState::Evaluate
          (WindowNaiveState *this,WindowAggregatorGlobalState *gsink,DataChunk *bounds,
          Vector *result,idx_t count,idx_t row_idx)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  DataChunk *payload;
  DataChunk *this_01;
  WindowExcludeMode WVar1;
  ulong uVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  bool *pbVar5;
  sel_t *psVar6;
  pointer pFVar7;
  aggregate_destructor_t p_Var8;
  idx_t iVar9;
  Vector *pVVar10;
  pointer pWVar11;
  const_reference pvVar12;
  reference pvVar13;
  ulong uVar14;
  reference pvVar15;
  ulong uVar16;
  idx_t iVar17;
  FrameBounds *frame_1;
  ulong uVar18;
  pointer pFVar19;
  FrameBounds *frame;
  size_type __n;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_02;
  idx_t iVar20;
  idx_t i;
  __ireturn_type _Var21;
  unsigned_long f;
  idx_t local_4e8;
  SubFrames *__range3;
  SelectionVector *local_4d8;
  AggregateObject *local_4d0;
  data_ptr_t local_4c8;
  Vector *local_4c0;
  Vector *local_4b8;
  data_ptr_t local_4b0;
  data_ptr_t local_4a8;
  RowLayout *local_4a0;
  data_ptr_t local_498;
  data_ptr_t local_490;
  data_ptr_t local_488;
  ulong local_480;
  data_ptr_t local_478;
  pointer local_470;
  EqualRow equal_row;
  HashRow hash_row;
  vector<duckdb::LogicalType,_true> types;
  PayloadScanner scanner;
  RowSet row_set;
  AggregateInputData aggr_input_data;
  BufferManager *local_388;
  pointer local_198;
  pointer local_190;
  LocalSortState local_sort;
  
  this_02 = &(this->super_WindowAggregatorLocalState).cursor;
  local_4e8 = count;
  local_4b8 = result;
  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator->(this_02);
  DataChunk::GetTypes(&types,&pWVar11->chunk);
  local_498 = (this->statef).data;
  local_4c8 = (this->statep).data;
  equal_row.state = this;
  hash_row.state = this;
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&row_set._M_h,0x800,&hash_row,&equal_row,(allocator_type *)&aggr_input_data);
  WVar1 = (this->aggregator->super_WindowAggregator).exclude_mode;
  pvVar12 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
  local_488 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
  local_490 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
  local_4b0 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,3);
  local_4d0 = &gsink->aggr;
  local_4c0 = &this->statef;
  __range3 = &this->frames;
  local_4a8 = pvVar12->data;
  this_00 = &this->arg_orderer;
  local_4a0 = &this->payload_layout;
  payload = &this->orderby_payload;
  this_01 = &this->orderby_sort;
  local_4d8 = &this->orderby_sel;
  iVar17 = 0;
  do {
    if (iVar17 == local_4e8) {
      FlushStates(this,gsink);
      aggr_input_data.bind_data.ptr = AggregateObject::GetFunctionData(local_4d0);
      pVVar10 = local_4c0;
      aggr_input_data.allocator =
           &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
      aggr_input_data.combine_type = PRESERVE_INPUT;
      (*(gsink->aggr).function.finalize)(local_4c0,&aggr_input_data,local_4b8,local_4e8,0);
      p_Var8 = (gsink->aggr).function.destructor;
      if (p_Var8 != (aggregate_destructor_t)0x0) {
        (*p_Var8)(pVVar10,&aggr_input_data,local_4e8);
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&row_set._M_h);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return;
    }
    uVar18 = *(ulong *)(local_488 + iVar17 * 8);
    uVar2 = *(ulong *)(local_490 + iVar17 * 8);
    if (WVar1 == NO_OTHER) {
      __n = 0;
    }
    else {
      uVar14 = row_idx;
      if (WVar1 != CURRENT_ROW) {
        uVar14 = *(ulong *)(local_4b0 + iVar17 * 8);
      }
      pvVar13 = vector<duckdb::FrameBounds,_true>::get<true>(__range3,0);
      if (uVar2 <= uVar14) {
        uVar14 = uVar2;
      }
      if (uVar14 <= uVar18) {
        uVar14 = uVar18;
      }
      pvVar13->start = uVar18;
      pvVar13->end = uVar14;
      if (WVar1 == TIES) {
        pvVar13 = vector<duckdb::FrameBounds,_true>::get<true>(__range3,1);
        uVar14 = row_idx + 1;
        if (uVar2 <= row_idx + 1) {
          uVar14 = uVar2;
        }
        if (uVar14 <= uVar18) {
          uVar14 = uVar18;
        }
        uVar16 = uVar18;
        if (uVar18 < row_idx) {
          uVar16 = row_idx;
        }
        if (uVar2 <= uVar16) {
          uVar16 = uVar2;
        }
        pvVar13->start = uVar16;
        pvVar13->end = uVar14;
        __n = 2;
LAB_00a88534:
        uVar14 = *(ulong *)(local_4a8 + iVar17 * 8);
      }
      else {
        __n = 1;
        if (WVar1 != CURRENT_ROW) goto LAB_00a88534;
        uVar14 = row_idx + 1;
      }
      if (uVar18 < uVar14) {
        uVar18 = uVar14;
      }
      if (uVar2 <= uVar18) {
        uVar18 = uVar2;
      }
    }
    pvVar13 = vector<duckdb::FrameBounds,_true>::get<true>(__range3,__n);
    pvVar13->start = uVar18;
    pvVar13->end = uVar2;
    pdVar3 = *(data_ptr_t *)(local_498 + iVar17 * 8);
    (*(gsink->aggr).function.initialize)(&local_4d0->function,pdVar3);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&row_set._M_h);
    if ((this_00->super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
        super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0) {
      pFVar7 = (this->frames).
               super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
               super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pFVar19 = (this->frames).
                     super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     _M_impl.super__Vector_impl_data._M_start; pFVar19 != pFVar7;
          pFVar19 = pFVar19 + 1) {
        for (aggr_input_data.bind_data.ptr = (FunctionData *)pFVar19->start;
            aggr_input_data.bind_data.ptr < (FunctionData *)pFVar19->end;
            aggr_input_data.bind_data.ptr =
                 (FunctionData *)((long)&(aggr_input_data.bind_data.ptr)->_vptr_FunctionData + 1)) {
          pbVar5 = (gsink->filter_mask).validity_mask;
          if ((pbVar5 == (bool *)0x0) ||
             (*(bool *)((long)&(aggr_input_data.bind_data.ptr)->_vptr_FunctionData + (long)pbVar5)
              == true)) {
            pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator->(this_02);
            if (((FunctionData *)(pWVar11->state).next_row_index <= aggr_input_data.bind_data.ptr)
               || (aggr_input_data.bind_data.ptr <
                   (FunctionData *)(pWVar11->state).current_row_index)) {
              FlushStates(this,gsink);
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_02);
              WindowCursor::Seek(pWVar11,(idx_t)aggr_input_data.bind_data.ptr);
            }
            if ((gsink->aggr).aggr_type == DISTINCT) {
              _Var21 = ::std::__detail::
                       _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&row_set,(value_type *)&aggr_input_data);
              if (((undefined1  [16])_Var21 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              goto LAB_00a88a90;
            }
            *(data_ptr_t *)(local_4c8 + this->flush_count * 8) = pdVar3;
            pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator->(this_02);
            iVar9 = (pWVar11->state).current_row_index;
            psVar6 = (this->update_sel).sel_vector;
            iVar20 = this->flush_count;
            uVar18 = iVar20 + 1;
            this->flush_count = uVar18;
            psVar6[iVar20] = (int)aggr_input_data.bind_data.ptr - (int)iVar9;
            if (0x7ff < uVar18) {
              FlushStates(this,gsink);
            }
          }
LAB_00a88a90:
        }
      }
    }
    else {
      GlobalSortState::GlobalSortState
                ((GlobalSortState *)&aggr_input_data,
                 (this->aggregator->executor->super_WindowExecutor).context,
                 &((this->aggregator->super_WindowAggregator).wexpr)->arg_orders,local_4a0);
      LocalSortState::LocalSortState(&local_sort);
      LocalSortState::Initialize(&local_sort,(GlobalSortState *)&aggr_input_data,local_388);
      pvVar15 = vector<duckdb::Vector,_true>::get<true>(&payload->data,0);
      pdVar4 = pvVar15->data;
      local_470 = (this->frames).
                  super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      uVar18 = 0;
      local_480 = row_idx;
      local_478 = pdVar3;
      for (pFVar19 = (this->frames).
                     super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar3 = local_478,
          row_idx = local_480, pFVar19 != local_470; pFVar19 = pFVar19 + 1) {
        for (iVar20 = pFVar19->start; iVar20 < pFVar19->end; iVar20 = iVar20 + 1) {
          pbVar5 = (gsink->filter_mask).validity_mask;
          if ((pbVar5 == (bool *)0x0) || (pbVar5[iVar20] == true)) {
            pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator->(this_00);
            if ((iVar20 < (pWVar11->state).current_row_index ||
                (pWVar11->state).next_row_index <= iVar20) || 0x7ff < uVar18) {
              if (uVar18 != 0) {
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_00);
                DataChunk::Reference(this_01,&pWVar11->chunk);
                DataChunk::Slice(this_01,local_4d8,uVar18);
                (this->orderby_payload).count = uVar18;
                LocalSortState::SinkChunk(&local_sort,this_01,payload);
              }
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_00);
              WindowCursor::Seek(pWVar11,iVar20);
              uVar18 = 0;
            }
            *(idx_t *)(pdVar4 + uVar18 * 8) = iVar20;
            pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator->(this_00);
            local_4d8->sel_vector[uVar18] = (int)iVar20 - (int)(pWVar11->state).current_row_index;
            uVar18 = uVar18 + 1;
          }
        }
      }
      if (uVar18 != 0) {
        pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  ::operator->(this_00);
        DataChunk::Reference(this_01,&pWVar11->chunk);
        DataChunk::Slice(this_01,local_4d8,uVar18);
        (this->orderby_payload).count = uVar18;
        LocalSortState::SinkChunk(&local_sort,this_01,payload);
      }
      GlobalSortState::AddLocalState((GlobalSortState *)&aggr_input_data,&local_sort);
      if (local_198 != local_190) {
        GlobalSortState::PrepareMergePhase((GlobalSortState *)&aggr_input_data);
        while (8 < (ulong)((long)local_190 - (long)local_198)) {
          GlobalSortState::InitializeMergeRound((GlobalSortState *)&aggr_input_data);
          MergeSorter::MergeSorter
                    ((MergeSorter *)&scanner,(GlobalSortState *)&aggr_input_data,local_388);
          MergeSorter::PerformInMergeRound((MergeSorter *)&scanner);
          GlobalSortState::CompleteMergeRound((GlobalSortState *)&aggr_input_data,false);
          MergeSorter::~MergeSorter((MergeSorter *)&scanner);
        }
        PayloadScanner::PayloadScanner(&scanner,(GlobalSortState *)&aggr_input_data,true);
        while( true ) {
          iVar20 = PayloadScanner::Remaining(&scanner);
          if (iVar20 == 0) break;
          DataChunk::Reset(payload);
          PayloadScanner::Scan(&scanner,payload);
          pvVar15 = vector<duckdb::Vector,_true>::get<true>(&payload->data,0);
          pdVar4 = pvVar15->data;
          for (uVar18 = 0; uVar18 < (this->orderby_payload).count; uVar18 = uVar18 + 1) {
            f = *(unsigned_long *)(pdVar4 + uVar18 * 8);
            pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator->(this_02);
            if (((pWVar11->state).next_row_index <= f) || (f < (pWVar11->state).current_row_index))
            {
              FlushStates(this,gsink);
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_02);
              WindowCursor::Seek(pWVar11,f);
            }
            if ((gsink->aggr).aggr_type == DISTINCT) {
              _Var21 = ::std::__detail::
                       _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&row_set,&f);
              if (((undefined1  [16])_Var21 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
              goto LAB_00a888f8;
            }
            else {
LAB_00a888f8:
              *(data_ptr_t *)(local_4c8 + this->flush_count * 8) = pdVar3;
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_02);
              iVar9 = (pWVar11->state).current_row_index;
              psVar6 = (this->update_sel).sel_vector;
              iVar20 = this->flush_count;
              uVar2 = iVar20 + 1;
              this->flush_count = uVar2;
              psVar6[iVar20] = (int)f - (int)iVar9;
              if (0x7ff < uVar2) {
                FlushStates(this,gsink);
              }
            }
          }
        }
        PayloadScanner::~PayloadScanner(&scanner);
      }
      LocalSortState::~LocalSortState(&local_sort);
      GlobalSortState::~GlobalSortState((GlobalSortState *)&aggr_input_data);
    }
    iVar17 = iVar17 + 1;
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

void WindowNaiveState::Evaluate(const WindowAggregatorGlobalState &gsink, const DataChunk &bounds, Vector &result,
                                idx_t count, idx_t row_idx) {
	const auto &aggr = gsink.aggr;
	auto &filter_mask = gsink.filter_mask;
	const auto types = cursor->chunk.GetTypes();

	auto fdata = FlatVector::GetData<data_ptr_t>(statef);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	HashRow hash_row(*this);
	EqualRow equal_row(*this);
	RowSet row_set(STANDARD_VECTOR_SIZE, hash_row, equal_row);

	WindowAggregator::EvaluateSubFrames(bounds, aggregator.exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = fdata[rid];
		aggr.function.initialize(aggr.function, agg_state);

		//	Reset the DISTINCT hash table
		row_set.clear();

		// 	Sort the input rows by the argument
		if (arg_orderer) {
			auto &context = aggregator.executor.context;
			auto &orders = aggregator.wexpr.arg_orders;
			GlobalSortState global_sort(context, orders, payload_layout);
			LocalSortState local_sort;
			local_sort.Initialize(global_sort, global_sort.buffer_manager);

			idx_t orderby_count = 0;
			auto orderby_row = FlatVector::GetData<idx_t>(orderby_payload.data[0]);
			for (const auto &frame : frames) {
				for (auto f = frame.start; f < frame.end; ++f) {
					//	FILTER before the ORDER BY
					if (!filter_mask.RowIsValid(f)) {
						continue;
					}

					if (!arg_orderer->RowIsVisible(f) || orderby_count >= STANDARD_VECTOR_SIZE) {
						if (orderby_count) {
							orderby_sort.Reference(arg_orderer->chunk);
							orderby_sort.Slice(orderby_sel, orderby_count);
							orderby_payload.SetCardinality(orderby_count);
							local_sort.SinkChunk(orderby_sort, orderby_payload);
						}
						orderby_count = 0;
						arg_orderer->Seek(f);
					}
					orderby_row[orderby_count] = f;
					orderby_sel.set_index(orderby_count++, arg_orderer->RowOffset(f));
				}
			}
			if (orderby_count) {
				orderby_sort.Reference(arg_orderer->chunk);
				orderby_sort.Slice(orderby_sel, orderby_count);
				orderby_payload.SetCardinality(orderby_count);
				local_sort.SinkChunk(orderby_sort, orderby_payload);
			}

			global_sort.AddLocalState(local_sort);
			if (global_sort.sorted_blocks.empty()) {
				return;
			}
			global_sort.PrepareMergePhase();
			while (global_sort.sorted_blocks.size() > 1) {
				global_sort.InitializeMergeRound();
				MergeSorter merge_sorter(global_sort, global_sort.buffer_manager);
				merge_sorter.PerformInMergeRound();
				global_sort.CompleteMergeRound(false);
			}

			PayloadScanner scanner(global_sort);
			while (scanner.Remaining()) {
				orderby_payload.Reset();
				scanner.Scan(orderby_payload);
				orderby_row = FlatVector::GetData<idx_t>(orderby_payload.data[0]);
				for (idx_t i = 0; i < orderby_payload.size(); ++i) {
					const auto f = orderby_row[i];
					//	Seek to the current position
					if (!cursor->RowIsVisible(f)) {
						//	We need to flush when we cross a chunk boundary
						FlushStates(gsink);
						cursor->Seek(f);
					}

					//	Filter out duplicates
					if (aggr.IsDistinct() && !row_set.insert(f).second) {
						continue;
					}

					pdata[flush_count] = agg_state;
					update_sel[flush_count++] = cursor->RowOffset(f);
					if (flush_count >= STANDARD_VECTOR_SIZE) {
						FlushStates(gsink);
					}
				}
			}
			return;
		}

		//	Just update the aggregate with the unfiltered input rows
		for (const auto &frame : frames) {
			for (auto f = frame.start; f < frame.end; ++f) {
				if (!filter_mask.RowIsValid(f)) {
					continue;
				}

				//	Seek to the current position
				if (!cursor->RowIsVisible(f)) {
					//	We need to flush when we cross a chunk boundary
					FlushStates(gsink);
					cursor->Seek(f);
				}

				//	Filter out duplicates
				if (aggr.IsDistinct() && !row_set.insert(f).second) {
					continue;
				}

				pdata[flush_count] = agg_state;
				update_sel[flush_count++] = cursor->RowOffset(f);
				if (flush_count >= STANDARD_VECTOR_SIZE) {
					FlushStates(gsink);
				}
			}
		}
	});

	//	Flush the final states
	FlushStates(gsink);

	//	Finalise the result aggregates and write to the result
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(statef, aggr_input_data, result, count, 0);

	//	Destruct the result aggregates
	if (aggr.function.destructor) {
		aggr.function.destructor(statef, aggr_input_data, count);
	}
}